

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O0

double calc_delh(double *x,double (*A) [3],double (*delh) [3])

{
  int local_2c;
  int local_28;
  int jdim;
  int idim_1;
  int idim;
  double (*delh_local) [3];
  double (*A_local) [3];
  double *x_local;
  
  for (jdim = 0; jdim < 3; jdim = jdim + 1) {
    (*delh)[jdim] = 0.0;
  }
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      (*delh)[local_28] = A[local_28][local_2c] * x[local_2c] + (*delh)[local_28];
    }
  }
  return 0.0;
}

Assistant:

double calc_delh(const double x[ndim], const double A[ndim][ndim], double (&delh)[ndim]) {
    for (int idim = 0; idim < ndim; idim++) {
        delh[idim] = 0e0;
    }
    for (int idim = 0; idim < ndim; idim++) {
        for (int jdim = 0; jdim < ndim; jdim++) {
            delh[idim] += A[idim][jdim] * x[jdim];
        }
    }
    return 0;
}